

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_path.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::ParsePathFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  scalar_function_t *psVar1;
  LogicalType varargs;
  long lVar2;
  undefined8 *puVar3;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var4;
  byte bVar5;
  initializer_list<duckdb::LogicalType> __l;
  LogicalType varchar_list_type;
  ScalarFunction func;
  undefined4 in_stack_fffffffffffffb94;
  undefined4 in_stack_fffffffffffffb9c;
  FunctionNullHandling in_stack_fffffffffffffba8;
  allocator_type local_451;
  scalar_function_t local_440;
  LogicalType local_420;
  LogicalType local_408;
  vector<duckdb::LogicalType,_true> local_3f0;
  LogicalType local_3d8;
  LogicalType local_3c0;
  undefined1 local_3a8 [144];
  LogicalType LStack_318;
  FunctionStability local_300;
  FunctionNullHandling FStack_2ff;
  FunctionErrors FStack_2fe;
  FunctionCollationHandling FStack_2fd;
  _Any_data _Stack_2f8;
  _Manager_type local_2e8;
  undefined8 auStack_2d8 [9];
  element_type *local_290;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  bVar5 = 0;
  LogicalType::LogicalType((LogicalType *)local_3a8,VARCHAR);
  LogicalType::LIST(&local_3d8,(LogicalType *)local_3a8);
  LogicalType::~LogicalType((LogicalType *)local_3a8);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(&local_408,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_408;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3f0,__l,
             &local_451);
  LogicalType::LogicalType(&local_420,&local_3d8);
  local_440.super__Function_base._M_functor._8_8_ = 0;
  local_440.super__Function_base._M_functor._M_unused._M_object = ParsePathFunction;
  local_440._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_440.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_3c0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_3c0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffb94;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 1;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffb9c;
  ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_3a8,&local_3f0,&local_420,&local_440,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffba8,(bind_lambda_function_t)in_RDI);
  LogicalType::~LogicalType(&local_3c0);
  if (local_440.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_440.super__Function_base._M_manager)
              ((_Any_data *)&local_440,(_Any_data *)&local_440,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_420);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3f0);
  LogicalType::~LogicalType(&local_408);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_280,(SimpleFunction *)local_3a8);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02433130;
  LogicalType::LogicalType(&local_280.super_BaseScalarFunction.return_type,&LStack_318);
  local_280.super_BaseScalarFunction.stability = local_300;
  local_280.super_BaseScalarFunction.null_handling = FStack_2ff;
  local_280.super_BaseScalarFunction.errors = FStack_2fe;
  local_280.super_BaseScalarFunction.collation_handling = FStack_2fd;
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  psVar1 = &local_280.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)&_Stack_2f8);
  puVar3 = auStack_2d8;
  pp_Var4 = &local_280.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var4 = (bind_scalar_function_t)*puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
  }
  local_280.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_290;
  local_280.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_288._M_pi;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
    }
  }
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_3a8 + 0x48),
             &LogicalType::VARCHAR);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_158,(SimpleFunction *)local_3a8);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02433130;
  LogicalType::LogicalType(&local_158.super_BaseScalarFunction.return_type,&LStack_318);
  psVar1 = &local_158.function;
  local_158.super_BaseScalarFunction.stability = local_300;
  local_158.super_BaseScalarFunction.null_handling = FStack_2ff;
  local_158.super_BaseScalarFunction.errors = FStack_2fe;
  local_158.super_BaseScalarFunction.collation_handling = FStack_2fd;
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)&_Stack_2f8);
  puVar3 = auStack_2d8;
  pp_Var4 = &local_158.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var4 = (bind_scalar_function_t)*puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
  }
  local_158.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_290;
  local_158.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_288._M_pi;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_288._M_pi)->_M_use_count = (local_288._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  local_3a8._0_8_ = &PTR__ScalarFunction_02432a00;
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
  }
  if (local_2e8 != (_Manager_type)0x0) {
    (*local_2e8)(&_Stack_2f8,&_Stack_2f8,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3a8);
  LogicalType::~LogicalType(&local_3d8);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ParsePathFun::GetFunctions() {
	auto varchar_list_type = LogicalType::LIST(LogicalType::VARCHAR);
	ScalarFunctionSet parse_path;
	ScalarFunction func({LogicalType::VARCHAR}, varchar_list_type, ParsePathFunction, nullptr, nullptr, nullptr,
	                    nullptr, LogicalType::INVALID, FunctionStability::CONSISTENT,
	                    FunctionNullHandling::SPECIAL_HANDLING);
	parse_path.AddFunction(func);
	// separator options
	func.arguments.emplace_back(LogicalType::VARCHAR);
	parse_path.AddFunction(func);
	return parse_path;
}